

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmp_image.cpp
# Opt level: O0

void __thiscall
Bitmap_Operation::BitmapFileHeader::get
          (BitmapFileHeader *this,vector<unsigned_char,_std::allocator<unsigned_char>_> *data)

{
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_RDI;
  size_t offset;
  size_t *in_stack_ffffffffffffffd8;
  
  set_value<unsigned_short>(in_RDI,in_stack_ffffffffffffffd8,(unsigned_short *)0x12c770);
  set_value<unsigned_int>(in_RDI,in_stack_ffffffffffffffd8,(uint *)0x12c788);
  set_value<unsigned_short>(in_RDI,in_stack_ffffffffffffffd8,(unsigned_short *)0x12c7a0);
  set_value<unsigned_short>(in_RDI,in_stack_ffffffffffffffd8,(unsigned_short *)0x12c7b8);
  set_value<unsigned_int>(in_RDI,in_stack_ffffffffffffffd8,(uint *)0x12c7d0);
  return;
}

Assistant:

void get( std::vector < uint8_t > & data )
        {
            size_t offset = 0;
            set_value( data, offset, bfType );
            set_value( data, offset, bfSize );
            set_value( data, offset, bfReserved1 );
            set_value( data, offset, bfReserved2 );
            set_value( data, offset, bfOffBits );
        }